

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int luv_udp_send(lua_State *L)

{
  int iVar1;
  uv_udp_t *handle;
  char *ip;
  ulong uVar2;
  uv_udp_send_t *req;
  luv_req_t *plVar3;
  int iVar4;
  int in_ESI;
  sockaddr_storage addr;
  uv_buf_t local_b8;
  sockaddr_in6 local_a8 [4];
  
  handle = luv_check_udp(L,in_ESI);
  local_b8.base = luaL_checklstring(L,2,&local_b8.len);
  ip = luaL_checklstring(L,3,(size_t *)0x0);
  uVar2 = luaL_checkinteger(L,4);
  iVar1 = uv_ip4_addr(ip,(int)uVar2,(sockaddr_in *)local_a8);
  if ((iVar1 != 0) && (iVar1 = uv_ip6_addr(ip,(int)uVar2,local_a8), iVar1 != 0)) {
    iVar1 = luaL_error(L,"Invalid IP address or port [%s:%d]",ip,uVar2 & 0xffffffff);
    return iVar1;
  }
  iVar1 = luv_check_continuation(L,5);
  req = (uv_udp_send_t *)lua_newuserdata(L,0x140);
  plVar3 = luv_setup_req(L,iVar1);
  req->data = plVar3;
  iVar4 = 1;
  iVar1 = uv_udp_send(req,handle,&local_b8,1,(sockaddr *)local_a8,luv_udp_send_cb);
  if (iVar1 < 0) {
    luv_cleanup_req(L,(luv_req_t *)req->data);
    lua_settop(L,-2);
    luv_error(L,iVar1);
    iVar4 = 3;
  }
  return iVar4;
}

Assistant:

static int luv_udp_send(lua_State* L) {
  uv_udp_t* handle = luv_check_udp(L, 1);
  uv_udp_send_t* req;
  int ret, ref;
  struct sockaddr_storage addr;
  struct sockaddr* addr_ptr;
  luv_handle_t* lhandle = handle->data;
  addr_ptr = luv_check_addr(L, &addr, 3, 4);
  ref = luv_check_continuation(L, 5);
  req = (uv_udp_send_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, lhandle->ctx, ref);
  size_t count;
  uv_buf_t* bufs = luv_check_bufs(L, 2, &count, (luv_req_t*)req->data);
  ret = uv_udp_send(req, handle, bufs, count, addr_ptr, luv_udp_send_cb);
  free(bufs);
  if (ret < 0) {
    luv_cleanup_req(L, (luv_req_t*)req->data);
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  lua_pushinteger(L, ret);
  return 1;
}